

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parameter.h
# Opt level: O0

void __thiscall parameters::parameters(parameters *this)

{
  initializer_list<float> __l;
  initializer_list<float> __l_00;
  initializer_list<float> __l_01;
  initializer_list<float> __l_02;
  initializer_list<float> __l_03;
  initializer_list<float> __l_04;
  initializer_list<float> __l_05;
  initializer_list<float> __l_06;
  initializer_list<float> __l_07;
  initializer_list<float> __l_08;
  initializer_list<float> __l_09;
  initializer_list<float> __l_10;
  initializer_list<float> __l_11;
  allocator<float> local_299;
  float local_298 [8];
  iterator local_278;
  size_type local_270;
  allocator<float> local_261;
  float local_260 [4];
  iterator local_250;
  size_type local_248;
  allocator<float> local_239;
  float local_238 [6];
  iterator local_220;
  size_type local_218;
  allocator<float> local_209;
  float local_208 [6];
  iterator local_1f0;
  size_type local_1e8;
  allocator<float> local_1d9;
  float local_1d8 [10];
  iterator local_1b0;
  size_type local_1a8;
  allocator<float> local_199;
  float local_198 [10];
  iterator local_170;
  size_type local_168;
  allocator<float> local_159;
  float local_158 [6];
  iterator local_140;
  size_type local_138;
  allocator<float> local_129;
  float local_128 [6];
  iterator local_110;
  size_type local_108;
  allocator<float> local_f9;
  float local_f8 [2];
  iterator local_f0;
  size_type local_e8;
  allocator<float> local_d9;
  float local_d8 [6];
  iterator local_c0;
  size_type local_b8;
  allocator<float> local_a9;
  float local_a8 [6];
  iterator local_90;
  size_type local_88;
  allocator<float> local_79;
  float local_78 [6];
  iterator local_60;
  size_type local_58;
  allocator<float> local_39;
  float local_38 [6];
  iterator local_20;
  size_type local_18;
  parameters *local_10;
  parameters *this_local;
  
  this->tempo = 1.0;
  local_38[4] = 1.0;
  local_38[5] = 1.0;
  local_38[0] = 1.0;
  local_38[1] = 1.0;
  local_38[2] = 1.0;
  local_38[3] = 1.0;
  local_20 = local_38;
  local_18 = 6;
  local_10 = this;
  std::allocator<float>::allocator(&local_39);
  __l_11._M_len = local_18;
  __l_11._M_array = local_20;
  std::vector<float,_std::allocator<float>_>::vector(&this->sq_score_scaling,__l_11,&local_39);
  std::allocator<float>::~allocator(&local_39);
  local_78[0] = 1.0;
  local_78[1] = 1.0;
  local_78[2] = 1.0;
  local_78[3] = 1.0;
  local_78[4] = 0.25;
  local_60 = local_78;
  local_58 = 5;
  std::allocator<float>::allocator(&local_79);
  __l_10._M_len = local_58;
  __l_10._M_array = local_60;
  std::vector<float,_std::allocator<float>_>::vector(&this->mobility_scaling,__l_10,&local_79);
  std::allocator<float>::~allocator(&local_79);
  local_a8[0] = 7.0;
  local_a8[1] = 4.0;
  local_a8[2] = 3.5;
  local_a8[3] = 1.5;
  local_a8[4] = 1.0;
  local_90 = local_a8;
  local_88 = 5;
  std::allocator<float>::allocator(&local_a9);
  __l_09._M_len = local_88;
  __l_09._M_array = local_90;
  std::vector<float,_std::allocator<float>_>::vector(&this->square_attks,__l_09,&local_a9);
  std::allocator<float>::~allocator(&local_a9);
  local_d8[0] = 1.0;
  local_d8[1] = 1.0;
  local_d8[2] = 1.0;
  local_d8[3] = 1.0;
  local_d8[4] = 1.0;
  local_c0 = local_d8;
  local_b8 = 5;
  std::allocator<float>::allocator(&local_d9);
  __l_08._M_len = local_b8;
  __l_08._M_array = local_c0;
  std::vector<float,_std::allocator<float>_>::vector(&this->attack_scaling,__l_08,&local_d9);
  std::allocator<float>::~allocator(&local_d9);
  this->knight_attks[4] = 16.4;
  this->knight_attks[5] = 25.3;
  this->knight_attks[0] = 1.0;
  this->knight_attks[1] = 3.0;
  this->knight_attks[2] = 4.0;
  this->knight_attks[3] = 9.45;
  this->bishop_attks[4] = 16.4;
  this->bishop_attks[5] = 25.3;
  this->bishop_attks[0] = 1.0;
  this->bishop_attks[1] = 3.0;
  this->bishop_attks[2] = 3.5;
  this->bishop_attks[3] = 9.45;
  this->rook_attks[4] = 7.2;
  this->rook_attks[5] = 14.65;
  this->rook_attks[0] = 0.5;
  this->rook_attks[1] = 1.5;
  this->rook_attks[2] = 4.5;
  this->rook_attks[3] = 4.725;
  this->queen_attks[4] = 3.6;
  this->queen_attks[5] = 8.825;
  this->queen_attks[0] = 0.25;
  this->queen_attks[1] = 0.75;
  this->queen_attks[2] = 2.25;
  this->queen_attks[3] = 2.3625;
  local_f8[0] = 1.0;
  local_f8[1] = 2.0;
  local_f0 = local_f8;
  local_e8 = 2;
  std::allocator<float>::allocator(&local_f9);
  __l_07._M_len = local_e8;
  __l_07._M_array = local_f0;
  std::vector<float,_std::allocator<float>_>::vector(&this->trapped_rook_penalty,__l_07,&local_f9);
  std::allocator<float>::~allocator(&local_f9);
  local_128[0] = 2.0;
  local_128[1] = 1.0;
  local_128[2] = 1.0;
  local_128[3] = 1.0;
  local_128[4] = 0.0;
  local_110 = local_128;
  local_108 = 5;
  std::allocator<float>::allocator(&local_129);
  __l_06._M_len = local_108;
  __l_06._M_array = local_110;
  std::vector<float,_std::allocator<float>_>::vector(&this->attk_queen_bonus,__l_06,&local_129);
  std::allocator<float>::~allocator(&local_129);
  local_158[0] = 1.0;
  local_158[1] = 1.0;
  local_158[2] = 2.0;
  local_158[3] = 3.0;
  local_158[4] = 4.0;
  local_140 = local_158;
  local_138 = 5;
  std::allocator<float>::allocator(&local_159);
  __l_05._M_len = local_138;
  __l_05._M_array = local_140;
  std::vector<float,_std::allocator<float>_>::vector(&this->pinned_scaling,__l_05,&local_159);
  std::allocator<float>::~allocator(&local_159);
  local_198[4] = 3.0;
  local_198[5] = 2.0;
  local_198[6] = 1.0;
  local_198[7] = 0.0;
  local_198[0] = 0.0;
  local_198[1] = 1.0;
  local_198[2] = 2.0;
  local_198[3] = 3.0;
  local_170 = local_198;
  local_168 = 8;
  std::allocator<float>::allocator(&local_199);
  __l_04._M_len = local_168;
  __l_04._M_array = local_170;
  std::vector<float,_std::allocator<float>_>::vector(&this->knight_outpost_bonus,__l_04,&local_199);
  std::allocator<float>::~allocator(&local_199);
  local_1d8[4] = 2.0;
  local_1d8[5] = 1.0;
  local_1d8[6] = 0.0;
  local_1d8[7] = 0.0;
  local_1d8[0] = 0.0;
  local_1d8[1] = 0.0;
  local_1d8[2] = 1.0;
  local_1d8[3] = 2.0;
  local_1b0 = local_1d8;
  local_1a8 = 8;
  std::allocator<float>::allocator(&local_1d9);
  __l_03._M_len = local_1a8;
  __l_03._M_array = local_1b0;
  std::vector<float,_std::allocator<float>_>::vector(&this->bishop_outpost_bonus,__l_03,&local_1d9);
  std::allocator<float>::~allocator(&local_1d9);
  local_208[0] = 0.0;
  local_208[1] = 1.0;
  local_208[2] = 1.0;
  local_208[3] = 1.0;
  local_208[4] = 1.0;
  local_208[5] = 0.0;
  local_1f0 = local_208;
  local_1e8 = 6;
  std::allocator<float>::allocator(&local_209);
  __l_02._M_len = local_1e8;
  __l_02._M_array = local_1f0;
  std::vector<float,_std::allocator<float>_>::vector
            (&this->center_influence_bonus,__l_02,&local_209);
  std::allocator<float>::~allocator(&local_209);
  this->pawn_king[0] = 1.0;
  this->pawn_king[1] = 2.0;
  this->pawn_king[2] = 3.0;
  this->knight_king[0] = 1.0;
  this->knight_king[1] = 2.0;
  this->knight_king[2] = 3.0;
  this->bishop_king[0] = 1.0;
  this->bishop_king[1] = 2.0;
  this->bishop_king[2] = 3.0;
  this->rook_king[0] = 1.0;
  this->rook_king[1] = 2.0;
  this->rook_king[2] = 3.0;
  this->rook_king[3] = 3.0;
  this->rook_king[4] = 4.0;
  this->queen_king[3] = 4.0;
  this->queen_king[4] = 4.0;
  this->queen_king[5] = 5.0;
  this->queen_king[6] = 6.0;
  this->queen_king[0] = 1.0;
  this->queen_king[1] = 3.0;
  this->queen_king[2] = 3.0;
  this->queen_king[3] = 4.0;
  *(float *)((long)(this->attack_combos + 4) + 0) = 10.0;
  *(float *)((long)(this->attack_combos + 4) + 4) = 15.0;
  *(float *)((long)(this->attack_combos + 4) + 8) = 12.0;
  *(float *)((long)(this->attack_combos + 4) + 0xc) = 15.0;
  *(float *)((long)(this->attack_combos + 3) + 4) = 4.0;
  *(float *)((long)(this->attack_combos + 3) + 8) = 4.0;
  *(float *)((long)(this->attack_combos + 3) + 0xc) = 10.0;
  *(float *)((long)(this->attack_combos + 3) + 0x10) = 15.0;
  *(float *)((long)(this->attack_combos + 2) + 8) = 4.0;
  *(float *)((long)(this->attack_combos + 2) + 0xc) = 4.0;
  *(undefined8 *)(this->attack_combos[2] + 4) = 0x41400000;
  *(float *)((long)(this->attack_combos + 1) + 0xc) = 4.0;
  *(float *)((long)(this->attack_combos + 1) + 0x10) = 15.0;
  *(float *)((long)(this->attack_combos + 2) + 0) = 0.0;
  *(float *)((long)(this->attack_combos + 2) + 4) = 4.0;
  *(undefined8 *)(this->attack_combos[0] + 4) = 0x41200000;
  *(float *)((long)(this->attack_combos + 1) + 4) = 4.0;
  *(float *)((long)(this->attack_combos + 1) + 8) = 4.0;
  *(float *)((long)(this->attack_combos + 0) + 0) = 0.0;
  *(float *)((long)(this->attack_combos + 0) + 4) = 0.0;
  *(float *)((long)(this->attack_combos + 0) + 8) = 0.0;
  *(float *)((long)(this->attack_combos + 0) + 0xc) = 4.0;
  this->attack_combos[4][4] = 20.0;
  local_238[0] = 0.5;
  local_238[1] = 4.0;
  local_238[2] = 8.0;
  local_238[3] = 16.0;
  local_238[4] = 32.0;
  local_220 = local_238;
  local_218 = 5;
  std::allocator<float>::allocator(&local_239);
  __l_01._M_len = local_218;
  __l_01._M_array = local_220;
  std::vector<float,_std::allocator<float>_>::vector(&this->attacker_weight,__l_01,&local_239);
  std::allocator<float>::~allocator(&local_239);
  local_260[0] = -3.0;
  local_260[1] = -2.0;
  local_260[2] = 2.0;
  local_260[3] = 3.0;
  local_250 = local_260;
  local_248 = 4;
  std::allocator<float>::allocator(&local_261);
  __l_00._M_len = local_248;
  __l_00._M_array = local_250;
  std::vector<float,_std::allocator<float>_>::vector(&this->king_shelter,__l_00,&local_261);
  std::allocator<float>::~allocator(&local_261);
  local_298[4] = 0.0;
  local_298[5] = 1.0;
  local_298[6] = 2.0;
  local_298[7] = 4.0;
  local_298[0] = -4.0;
  local_298[1] = -2.0;
  local_298[2] = -1.0;
  local_298[3] = 0.0;
  local_278 = local_298;
  local_270 = 8;
  std::allocator<float>::allocator(&local_299);
  __l._M_len = local_270;
  __l._M_array = local_278;
  std::vector<float,_std::allocator<float>_>::vector(&this->king_safe_sqs,__l,&local_299);
  std::allocator<float>::~allocator(&local_299);
  this->uncastled_penalty = 5.0;
  this->connected_rook_bonus = 1.0;
  this->doubled_bishop_bonus = 4.0;
  this->open_file_bonus = 1.0;
  this->bishop_open_center_bonus = 1.0;
  this->bishop_color_complex_penalty = 1.0;
  this->bishop_penalty_pawns_same_color = 1.0;
  this->rook_7th_bonus = 2.0;
  this->doubled_pawn_penalty = 4.0;
  this->backward_pawn_penalty = 1.0;
  this->isolated_pawn_penalty = 4.0;
  this->passed_pawn_bonus = 2.0;
  this->semi_open_pawn_penalty = 1.0;
  this->counter_move_bonus = 5.0;
  this->threat_evasion_bonus = 2.0;
  this->fixed_depth = -1;
  memcpy(this->pawn_lever_score,&DAT_001775fc,0x100);
  return;
}

Assistant:

parameters() {}